

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,PrimitiveInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *specificInstance,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames)

{
  HierarchicalInstanceSyntax *instanceSyntax;
  NetType *netType;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  long lVar2;
  ulong uVar3;
  string_view sVar4;
  ASTContext context;
  ASTContext local_68;
  
  ASTContext::resetFlags(&local_68,parentContext,(bitmask<slang::ast::ASTFlags>)0x20);
  netType = Scope::getDefaultNetType(local_68.scope.ptr);
  if (specificInstance == (HierarchicalInstanceSyntax *)0x0) {
    uVar3 = (syntax->instances).elements._M_extent._M_extent_value + 1;
    if (1 < uVar3) {
      uVar3 = uVar3 >> 1;
      lVar2 = 0;
      do {
        ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((syntax->instances).elements._M_ptr)->
                                     super_ConstTokenOrSyntax).
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar2));
        instanceSyntax = (HierarchicalInstanceSyntax *)*ppSVar1;
        sVar4 = parsing::Token::valueText(&syntax->type);
        createUninstantiatedDef<slang::syntax::PrimitiveInstantiationSyntax>
                  (compilation,syntax,instanceSyntax,sVar4,&local_68,
                   (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0),
                   results,implicitNets,implicitNetNames,netType);
        lVar2 = lVar2 + 0x30;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  else {
    sVar4 = parsing::Token::valueText(&syntax->type);
    createUninstantiatedDef<slang::syntax::PrimitiveInstantiationSyntax>
              (compilation,syntax,specificInstance,sVar4,&local_68,
               (span<const_slang::ast::Expression_*const,_18446744073709551615UL>)ZEXT816(0),results
               ,implicitNets,implicitNetNames,netType);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(Compilation& compilation,
                                         const PrimitiveInstantiationSyntax& syntax,
                                         const syntax::HierarchicalInstanceSyntax* specificInstance,
                                         const ASTContext& parentContext,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets,
                                         SmallSet<std::string_view, 8>& implicitNetNames) {
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto& netType = context.scope->getDefaultNetType();

    if (specificInstance) {
        createUninstantiatedDef(compilation, syntax, specificInstance, syntax.type.valueText(),
                                context, {}, results, implicitNets, implicitNetNames, netType);
    }
    else {
        for (auto instanceSyntax : syntax.instances) {
            createUninstantiatedDef(compilation, syntax, instanceSyntax, syntax.type.valueText(),
                                    context, {}, results, implicitNets, implicitNetNames, netType);
        }
    }
}